

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2espec.cc
# Opt level: O2

void e2e_fdb_set_person(storage_t *st,person_t *p)

{
  char *__s;
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  fdb_kvs_handle *pfVar5;
  checkpoint_t *pcVar6;
  bool bVar7;
  fdb_status fVar8;
  fdb_status fVar9;
  size_t sVar10;
  fdb_doc *local_48;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  local_48 = (fdb_doc *)0x0;
  strcpy(p->keyspace,st->keyspace);
  sVar10 = strlen(p->key);
  fdb_doc_create(&local_48,p,sVar10,(void *)0x0,0,p,0xe0c);
  fVar8 = fdb_get(st->all_docs,local_48);
  fVar9 = fdb_set(st->all_docs,local_48);
  if (fVar9 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
            ,0xcd);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                  ,0xcd,"void e2e_fdb_set_person(storage_t *, person_t *)");
  }
  pfVar5 = st->index1;
  __s = p->name;
  sVar10 = strlen(__s);
  fVar9 = fdb_set_kv(pfVar5,__s,sVar10,local_48->key,local_48->keylen);
  if (fVar9 == FDB_RESULT_SUCCESS) {
    pfVar5 = st->index2;
    sVar10 = strlen(__s);
    fVar9 = fdb_set_kv(pfVar5,__s,sVar10,&p->age,4);
    if (fVar9 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
              ,0xd6);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                    ,0xd6,"void e2e_fdb_set_person(storage_t *, person_t *)");
    }
    save_tx(st,local_48->key,local_48->keylen,1);
    if (fVar8 != FDB_RESULT_SUCCESS) {
      bVar7 = is_indexed(st->index_params,p);
      if (bVar7) {
        pcVar6 = st->v_chk;
        uVar2 = pcVar6->num_indexed;
        uVar3 = pcVar6->sum_age_indexed;
        iVar4 = p->age;
        pcVar6->num_indexed = uVar2 + 1;
        pcVar6->sum_age_indexed = iVar4 + uVar3;
        free(local_48->body);
        local_48->body = (void *)0x0;
        if (st->verify_set == true) {
          fVar8 = fdb_get(st->all_docs,local_48);
          if (fVar8 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                    ,0xe5);
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                          ,0xe5,"void e2e_fdb_set_person(storage_t *, person_t *)");
          }
        }
      }
      piVar1 = &st->v_chk->ndocs;
      *piVar1 = *piVar1 + 1;
    }
    fdb_doc_free(local_48);
    return;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
          ,0xd1);
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                ,0xd1,"void e2e_fdb_set_person(storage_t *, person_t *)");
}

Assistant:

void e2e_fdb_set_person(storage_t *st, person_t *p){

    TEST_INIT();
    fdb_status status;
    fdb_doc *doc = NULL;
    bool indexed;
    bool existed;

    strcpy(p->keyspace, st->keyspace);
    fdb_doc_create(&doc, p->key, strlen(p->key),
                   NULL, 0, (void *)p, sizeof(person_t));
    status = fdb_get(st->all_docs, doc);
    existed = (status == FDB_RESULT_SUCCESS);

    // main person.key -> person doc
    status = fdb_set(st->all_docs, doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // index person.name -> person doc
    status = fdb_set_kv(st->index1, p->name, strlen(p->name), doc->key, doc->keylen);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // index person.name -> person age
    status = fdb_set_kv(st->index2, p->name, strlen(p->name), (void *)&p->age,
                        sizeof(int));
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // update transaction db
    save_tx(st, doc->key, doc->keylen, SET_PERSON);

    if(!existed){  // new doc
        indexed = is_indexed(st->index_params, p);
        if(indexed){  // within storage index
            // update verification checkpoint
            st->v_chk->num_indexed++;
            st->v_chk->sum_age_indexed+=p->age;
            free(doc->body);
            doc->body = NULL;
            if (st->verify_set) {
                status = fdb_get(st->all_docs, doc);
                TEST_CHK(status == FDB_RESULT_SUCCESS);
            }
        }
        st->v_chk->ndocs += 1;
    }

    fdb_doc_free(doc);
    doc=NULL;

}